

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_encode.cpp
# Opt level: O2

void __thiscall
ktx::CommandEncode::OptionsEncode::process
          (OptionsEncode *this,Options *param_1,ParseResult *args,Reporter *report)

{
  size_t sVar1;
  bool bVar2;
  OptionValue *pOVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  optional<VkFormat> oVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> formatStr;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,kCodec,&local_62);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_60);
  if (pOVar3->m_count == 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,kFormat,&local_61);
    pOVar3 = cxxopts::ParseResult::operator[](args,&local_40);
    sVar1 = pOVar3->m_count;
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    if (sVar1 != 0) {
      Reporter::fatal_usage<char_const(&)[51]>
                (report,(char (*) [51])"Format and codec can\'t be both specified together.");
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,kFormat,(allocator<char> *)&local_40);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_60);
  sVar1 = pOVar3->m_count;
  std::__cxx11::string::~string((string *)&local_60);
  if (sVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,kFormat,&local_62);
    pOVar3 = cxxopts::ParseResult::operator[](args,&local_40);
    pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
    std::__cxx11::string::string((string *)&local_60,(string *)pbVar4);
    std::__cxx11::string::~string((string *)&local_40);
    oVar5 = parseVkFormat(&local_60);
    if (((ulong)oVar5.super__Optional_base<VkFormat,_true,_true>._M_payload.
                super__Optional_payload_base<VkFormat> >> 0x20 & 1) == 0) {
      Reporter::fatal_usage<char_const(&)[54],std::__cxx11::string_const&>
                (report,(char (*) [54])"The requested format is invalid or unsupported: \"{}\".",
                 &local_60);
    }
    this->vkFormat =
         oVar5.super__Optional_base<VkFormat,_true,_true>._M_payload.
         super__Optional_payload_base<VkFormat>._M_payload;
    bVar2 = isFormatAstc(oVar5.super__Optional_base<VkFormat,_true,_true>._M_payload.
                         super__Optional_payload_base<VkFormat>._M_payload);
    if (!bVar2) {
      Reporter::fatal_usage<char_const(&)[48]>
                (report,(char (*) [48])"Optional option \'format\' is not an ASTC format.");
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void CommandEncode::OptionsEncode::process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
    if (args[kCodec].count() && args[kFormat].count())
        report.fatal_usage("Format and codec can't be both specified together.");

    if (args[kFormat].count()) {
        const auto formatStr = args[kFormat].as<std::string>();
        const auto parsedVkFormat = parseVkFormat(formatStr);
        if (!parsedVkFormat)
            report.fatal_usage("The requested format is invalid or unsupported: \"{}\".", formatStr);

        vkFormat = *parsedVkFormat;

        if (!isFormatAstc(vkFormat)) {
            report.fatal_usage("Optional option 'format' is not an ASTC format.");
        }
    }
}